

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

result<long,_toml::error_info> * toml::read_hex_int<long>(string *str,source_location *src)

{
  byte bVar1;
  void *this;
  success<long> s;
  char *in_RDX;
  string *in_RSI;
  source_location *in_RDI;
  istringstream iss;
  long val;
  int max_digits;
  long *in_stack_fffffffffffffc58;
  failure_type *f;
  undefined7 in_stack_fffffffffffffc60;
  source_location *psVar2;
  source_location *this_00;
  int in_stack_fffffffffffffcac;
  error_info *in_stack_fffffffffffffcb8;
  pointer in_stack_fffffffffffffe18;
  pointer in_stack_fffffffffffffe20;
  _Alloc_hider in_stack_fffffffffffffe28;
  source_location local_1a8 [3];
  long local_28;
  undefined4 local_1c;
  
  local_1c = 0x3f;
  local_28 = 0;
  this_00 = local_1a8;
  psVar2 = in_RDI;
  std::__cxx11::istringstream::istringstream((istringstream *)this_00,in_RSI,_S_in);
  this = (void *)std::istream::operator>>(this_00,CLI::std::hex);
  std::istream::operator>>(this,&local_28);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    s = ok<long&>(in_stack_fffffffffffffc58);
    result<long,_toml::error_info>::result
              ((result<long,_toml::error_info> *)in_RDI,(success_type)s.value);
  }
  else {
    CLI::std::__cxx11::to_string(in_stack_fffffffffffffcac);
    std::operator+(in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(bVar1,in_stack_fffffffffffffc60));
    source_location::source_location(this_00,psVar2);
    CLI::std::__cxx11::to_string(in_stack_fffffffffffffcac);
    std::operator+(in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(bVar1,in_stack_fffffffffffffc60));
    make_error_info<>((string *)in_stack_fffffffffffffe28._M_p,&in_stack_fffffffffffffe20->first,
                      (string *)in_stack_fffffffffffffe18);
    f = (failure_type *)&stack0xfffffffffffffdf0;
    err<toml::error_info>(in_stack_fffffffffffffcb8);
    result<long,_toml::error_info>::result
              ((result<long,_toml::error_info> *)CONCAT17(bVar1,in_stack_fffffffffffffc60),f);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x69f6d8);
    error_info::~error_info((error_info *)CONCAT17(bVar1,in_stack_fffffffffffffc60));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffc60));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffc60));
    source_location::~source_location((source_location *)CONCAT17(bVar1,in_stack_fffffffffffffc60));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffc60));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffc60));
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1a8);
  return (result<long,_toml::error_info> *)psVar2;
}

Assistant:

result<T, error_info>
read_hex_int(const std::string& str, const source_location src)
{
    constexpr auto max_digits = std::numeric_limits<T>::digits;
    assert( ! str.empty());

    T val{0};
    std::istringstream iss(str);
    iss >> std::hex >> val;
    if(iss.fail())
    {
        return err(make_error_info("toml::parse_hex_integer: "
            "too large integer: current max value = 2^" + std::to_string(max_digits),
            std::move(src), "must be < 2^" + std::to_string(max_digits)));
    }
    return ok(val);
}